

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void Round(uint32_t a,uint32_t b,uint32_t c,uint32_t *d,uint32_t e,uint32_t f,uint32_t g,uint32_t *h
          ,uint32_t k,uint32_t w)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t t2;
  uint32_t t1;
  uint32_t f_local;
  uint32_t e_local;
  uint32_t *d_local;
  uint32_t c_local;
  uint32_t b_local;
  uint32_t a_local;
  
  uVar4 = *h;
  uVar1 = Sigma1(e);
  uVar2 = Ch(e,f,g);
  iVar3 = uVar4 + uVar1 + uVar2 + k + w;
  uVar4 = Sigma0(a);
  uVar1 = Maj(a,b,c);
  *d = iVar3 + *d;
  *h = iVar3 + uVar4 + uVar1;
  return;
}

Assistant:

static void Round(uint32_t a, uint32_t b, uint32_t c, uint32_t *d, uint32_t e, uint32_t f, uint32_t g, uint32_t *h, uint32_t k, uint32_t w)
{
	uint32_t t1 = *h + Sigma1(e) + Ch(e, f, g) + k + w;
	uint32_t t2 = Sigma0(a) + Maj(a, b, c);
	*d += t1;
	*h = t1 + t2;
}